

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  istream *this;
  ostream *poVar2;
  bool bVar3;
  int b;
  int a;
  int n;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> v;
  int local_74;
  int local_70;
  int local_6c;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_68;
  pair<int,_int> local_48;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_40;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::istream::operator>>((istream *)&std::cin,&local_6c);
  while( true ) {
    bVar3 = local_6c == 0;
    local_6c = local_6c + -1;
    if (bVar3) break;
    this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_70);
    std::istream::operator>>(this,&local_74);
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_68,&local_48)
    ;
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_40,
             (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_68);
  iVar1 = eval_postfix((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       &local_40);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_40);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_68);
  return 0;
}

Assistant:

int main() {
    vector<pair<int, int>> v;
    int n, a, b;
    cin >> n;
    while (n--) {
        cin >> a >> b;
        v.push_back(make_pair(a, b));
    }
    cout << eval_postfix(v) << endl;
}